

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

void __thiscall SceneParser::~SceneParser(SceneParser *this)

{
  CubeMap *this_00;
  bool bVar1;
  reference ppMVar2;
  reference ppOVar3;
  Object3D *object;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Object3D_*,_std::allocator<Object3D_*>_> *__range1_1;
  Material *material;
  iterator __end1;
  iterator __begin1;
  vector<Material_*,_std::allocator<Material_*>_> *__range1;
  SceneParser *this_local;
  
  if (this->_group != (Group *)0x0) {
    (*(this->_group->super_Object3D)._vptr_Object3D[1])();
  }
  if (this->_camera != (Camera *)0x0) {
    (*this->_camera->_vptr_Camera[1])();
  }
  __end1 = std::vector<Material_*,_std::allocator<Material_*>_>::begin(&this->_materials);
  material = (Material *)
             std::vector<Material_*,_std::allocator<Material_*>_>::end(&this->_materials);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Material_**,_std::vector<Material_*,_std::allocator<Material_*>_>_>
                                *)&material);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<Material_**,_std::vector<Material_*,_std::allocator<Material_*>_>_>
              ::operator*(&__end1);
    if (*ppMVar2 != (Material *)0x0) {
      operator_delete(*ppMVar2);
    }
    __gnu_cxx::__normal_iterator<Material_**,_std::vector<Material_*,_std::allocator<Material_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<Object3D_*,_std::allocator<Object3D_*>_>::begin(&this->_objects);
  object = (Object3D *)std::vector<Object3D_*,_std::allocator<Object3D_*>_>::end(&this->_objects);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Object3D_**,_std::vector<Object3D_*,_std::allocator<Object3D_*>_>_>
                        *)&object);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<Object3D_**,_std::vector<Object3D_*,_std::allocator<Object3D_*>_>_>
              ::operator*(&__end1_1);
    if (*ppOVar3 != (Object3D *)0x0) {
      (*(*ppOVar3)->_vptr_Object3D[1])();
    }
    __gnu_cxx::__normal_iterator<Object3D_**,_std::vector<Object3D_*,_std::allocator<Object3D_*>_>_>
    ::operator++(&__end1_1);
  }
  this_00 = this->_cubemap;
  if (this_00 != (CubeMap *)0x0) {
    CubeMap::~CubeMap(this_00);
    operator_delete(this_00);
  }
  std::vector<Object3D_*,_std::allocator<Object3D_*>_>::~vector(&this->_objects);
  std::vector<Material_*,_std::allocator<Material_*>_>::~vector(&this->_materials);
  std::__cxx11::string::~string((string *)&this->_basepath);
  std::vector<Object3D_*,_std::allocator<Object3D_*>_>::~vector(&this->lights);
  return;
}

Assistant:

SceneParser::~SceneParser() {
    delete _group;
    delete _camera;
    for (auto *material : _materials) {
        delete material;
    }
    for (auto *object : _objects) {
        delete object;
    }
    delete _cubemap;
}